

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,QStringBuilder<QString_&,_QLatin1String> *b)

{
  ArrayOptions *pAVar1;
  long lVar2;
  Data *pDVar3;
  long lVar4;
  long lVar5;
  char16_t *__src;
  long lVar6;
  long lVar7;
  char16_t *__dest;
  
  pDVar3 = (a->d).d;
  lVar4 = (a->d).size;
  lVar7 = (b->a->d).size + lVar4 + (b->b).m_size;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)lVar4);
    pDVar3 = (a->d).d;
    if (pDVar3 != (Data *)0x0) goto LAB_0013407f;
    if (0 < lVar7) {
      lVar4 = (a->d).size;
      goto LAB_001340d4;
    }
  }
  else {
LAB_0013407f:
    lVar5 = (pDVar3->super_QArrayData).alloc;
    lVar4 = (a->d).size;
    lVar6 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((lVar5 - lVar4) - lVar6 < lVar7) {
      lVar2 = lVar5 * 2;
      if (lVar5 * 2 < lVar7) {
        lVar2 = lVar7;
      }
      lVar7 = lVar2;
      if ((1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar5 - lVar6 <= lVar7)) {
LAB_001340d4:
        if (lVar7 < lVar4) {
          lVar7 = lVar4;
        }
        QString::reallocData((longlong)a,(AllocationOption)lVar7);
        pDVar3 = (a->d).d;
        if (pDVar3 == (Data *)0x0) goto LAB_00134104;
        lVar5 = (pDVar3->super_QArrayData).alloc;
      }
      if (lVar5 != 0) {
        pAVar1 = &(pDVar3->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_00134115;
  }
LAB_00134104:
  QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_00134115:
  __dest = (a->d).ptr + (a->d).size;
  lVar4 = (b->a->d).size;
  if (lVar4 != 0) {
    __src = (b->a->d).ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,__src,lVar4 * 2);
  }
  QAbstractConcatenable::appendLatin1To(b->b,(QChar *)(__dest + lVar4));
  QString::resize((longlong)a);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}